

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O2

void __thiscall
duckdb::BaseResultRenderer::Render
          (BaseResultRenderer *this,ResultRenderType render_mode,string *val)

{
  _func_int *UNRECOVERED_JUMPTABLE_00;
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  switch(render_mode) {
  case LAYOUT:
    UNRECOVERED_JUMPTABLE_00 = this->_vptr_BaseResultRenderer[2];
    break;
  case COLUMN_NAME:
    UNRECOVERED_JUMPTABLE_00 = this->_vptr_BaseResultRenderer[3];
    break;
  case COLUMN_TYPE:
    UNRECOVERED_JUMPTABLE_00 = this->_vptr_BaseResultRenderer[4];
    break;
  case VALUE:
    UNRECOVERED_JUMPTABLE_00 = this->_vptr_BaseResultRenderer[5];
    goto LAB_0031a661;
  case NULL_VALUE:
    UNRECOVERED_JUMPTABLE_00 = this->_vptr_BaseResultRenderer[6];
LAB_0031a661:
    (*UNRECOVERED_JUMPTABLE_00)(this,val,&this->value_type,UNRECOVERED_JUMPTABLE_00);
    return;
  case FOOTER:
    UNRECOVERED_JUMPTABLE_00 = this->_vptr_BaseResultRenderer[7];
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unsupported type for result renderer",&local_39);
    InternalException::InternalException(this_00,&local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  (*UNRECOVERED_JUMPTABLE_00)(this,val);
  return;
}

Assistant:

void BaseResultRenderer::Render(ResultRenderType render_mode, const string &val) {
	switch (render_mode) {
	case ResultRenderType::LAYOUT:
		RenderLayout(val);
		break;
	case ResultRenderType::COLUMN_NAME:
		RenderColumnName(val);
		break;
	case ResultRenderType::COLUMN_TYPE:
		RenderType(val);
		break;
	case ResultRenderType::VALUE:
		RenderValue(val, value_type);
		break;
	case ResultRenderType::NULL_VALUE:
		RenderNull(val, value_type);
		break;
	case ResultRenderType::FOOTER:
		RenderFooter(val);
		break;
	default:
		throw InternalException("Unsupported type for result renderer");
	}
}